

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O1

void Curl_pgrsSetUploadCounter(Curl_easy *data,curl_off_t size)

{
  timeval *ptVar1;
  long lVar2;
  long lVar3;
  time_t tVar4;
  timeval newer;
  
  newer = curlx_tvnow();
  (data->progress).uploaded = size;
  lVar2 = (data->set).max_send_speed;
  if (lVar2 < 1) {
    return;
  }
  ptVar1 = &(data->progress).ul_limit_start;
  if (ptVar1->tv_sec != 0 || (data->progress).ul_limit_start.tv_usec != 0) {
    lVar3 = size - (data->progress).ul_limit_size;
    if (lVar3 < lVar2) {
      return;
    }
    tVar4 = curlx_tvdiff(newer,*ptVar1);
    if (tVar4 < (lVar3 * 1000) / lVar2) {
      return;
    }
  }
  (data->progress).ul_limit_start = newer;
  (data->progress).ul_limit_size = size;
  return;
}

Assistant:

void Curl_pgrsSetUploadCounter(struct Curl_easy *data, curl_off_t size)
{
  struct timeval now = Curl_tvnow();

  data->progress.uploaded = size;

  /* upload speed limit */
  if((data->set.max_send_speed > 0) &&
     (Curl_pgrsLimitWaitTime(data->progress.uploaded,
                             data->progress.ul_limit_size,
                             data->set.max_send_speed,
                             data->progress.ul_limit_start,
                             now) == 0)) {
    data->progress.ul_limit_start = now;
    data->progress.ul_limit_size = size;
  }
}